

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * dmrC_parens_expression(dmr_C *C,token *token,expression **expr,char *where)

{
  position pVar1;
  token *ptVar2;
  expression *peVar3;
  statement *stmt;
  
  ptVar2 = dmrC_expect_token(C,token,0x28,where);
  pVar1 = ptVar2->pos;
  if (((pVar1._0_4_ & 0x3f) == 0x11) && ((ptVar2->field_2).special == 0x7b)) {
    peVar3 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(undefined1 *)peVar3 = 0x13;
    peVar3->pos = pVar1;
    stmt = dmrC_alloc_statement(C,ptVar2->pos,3);
    *expr = peVar3;
    (peVar3->field_5).statement = stmt;
    dmrC_start_symbol_scope(C);
    ptVar2 = dmrC_compound_statement(C,ptVar2->next,stmt);
    dmrC_end_symbol_scope(C);
    ptVar2 = dmrC_expect_token(C,ptVar2,0x7d,"at end of statement expression");
  }
  else {
    ptVar2 = comma_expression(C,ptVar2,expr);
  }
  ptVar2 = dmrC_expect_token(C,ptVar2,0x29,where);
  return ptVar2;
}

Assistant:

struct token *dmrC_parens_expression(struct dmr_C *C, struct token *token, struct expression **expr, const char *where)
{
	token = dmrC_expect_token(C, token, '(', where);
	if (dmrC_match_op(token, '{')) {
		struct expression *e = dmrC_alloc_expression(C, token->pos, EXPR_STATEMENT);
		struct statement *stmt = dmrC_alloc_statement(C, token->pos, STMT_COMPOUND);
		*expr = e;
		e->statement = stmt;
		dmrC_start_symbol_scope(C);
		token = dmrC_compound_statement(C, token->next, stmt);
		dmrC_end_symbol_scope(C);
		token = dmrC_expect_token(C, token, '}', "at end of statement expression");
	} else
		token = dmrC_parse_expression(C, token, expr);
	return dmrC_expect_token(C, token, ')', where);
}